

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

uintptr_t upb_Arena_SpaceAllocated(upb_Arena *arena,size_t *fused_count)

{
  _Bool _Var1;
  upb_ArenaInternal *puVar2;
  uintptr_t allocated_1;
  uintptr_t allocated;
  upb_ArenaInternal *previous;
  uintptr_t local_38;
  uintptr_t previous_or_tail;
  size_t local_fused_count;
  uintptr_t memsize;
  upb_ArenaInternal *ai;
  size_t *fused_count_local;
  upb_Arena *arena_local;
  
  memsize = (uintptr_t)upb_Arena_Internal(arena);
  local_fused_count = 0;
  previous_or_tail = 0;
  local_38 = ((upb_ArenaInternal *)memsize)->previous_or_tail;
  while( true ) {
    _Var1 = _upb_Arena_IsTaggedPrevious(local_38);
    if (!_Var1) {
      for (; memsize != 0; memsize = *(uintptr_t *)(memsize + 0x18)) {
        local_fused_count = local_fused_count + *(long *)(memsize + 0x30);
        previous_or_tail = previous_or_tail + 1;
      }
      if (fused_count != (size_t *)0x0) {
        *fused_count = previous_or_tail;
      }
      return local_fused_count;
    }
    puVar2 = _upb_Arena_PreviousFromTagged(local_38);
    if (puVar2 == (upb_ArenaInternal *)memsize) break;
    local_fused_count = local_fused_count + puVar2->space_allocated;
    local_38 = puVar2->previous_or_tail;
    previous_or_tail = previous_or_tail + 1;
  }
  __assert_fail("previous != ai",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/arena.c"
                ,0x106,"uintptr_t upb_Arena_SpaceAllocated(const upb_Arena *, size_t *)");
}

Assistant:

uintptr_t upb_Arena_SpaceAllocated(const upb_Arena* arena,
                                   size_t* fused_count) {
  upb_ArenaInternal* ai = upb_Arena_Internal(arena);
  uintptr_t memsize = 0;
  size_t local_fused_count = 0;
  // Our root would get updated by any racing fuses before our target arena
  // became reachable from the root via the linked list; in order to preserve
  // monotonic output (any arena counted by a previous invocation is counted by
  // this one), we instead iterate forwards and backwards so that we only see
  // the results of completed fuses.
  uintptr_t previous_or_tail =
      upb_Atomic_Load(&ai->previous_or_tail, memory_order_acquire);
  while (_upb_Arena_IsTaggedPrevious(previous_or_tail)) {
    upb_ArenaInternal* previous =
        _upb_Arena_PreviousFromTagged(previous_or_tail);
    UPB_ASSERT(previous != ai);
    UPB_TSAN_CHECK_PUBLISHED(previous);
    // Unfortunate macro behavior; prior to C11 when using nonstandard atomics
    // this returns a void* and can't be used with += without an intermediate
    // conversion to an integer.
    // Relaxed is safe - no subsequent reads depend this one
    uintptr_t allocated =
        upb_Atomic_Load(&previous->space_allocated, memory_order_relaxed);
    memsize += allocated;
    previous_or_tail =
        upb_Atomic_Load(&previous->previous_or_tail, memory_order_acquire);
    local_fused_count++;
  }
  while (ai != NULL) {
    UPB_TSAN_CHECK_PUBLISHED(ai);
    // Unfortunate macro behavior; prior to C11 when using nonstandard atomics
    // this returns a void* and can't be used with += without an intermediate
    // conversion to an integer.
    // Relaxed is safe - no subsequent reads depend this one
    uintptr_t allocated =
        upb_Atomic_Load(&ai->space_allocated, memory_order_relaxed);
    memsize += allocated;
    ai = upb_Atomic_Load(&ai->next, memory_order_acquire);
    local_fused_count++;
  }

  if (fused_count) *fused_count = local_fused_count;
  return memsize;
}